

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O1

VmConstant *
CreateConstantStruct(Allocator *allocator,SynBase *source,char *value,int size,TypeBase *structType)

{
  int iVar1;
  undefined4 extraout_var;
  VmType VVar3;
  VmConstant *pVVar2;
  
  if ((size & 3U) == 0) {
    iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
    pVVar2 = (VmConstant *)CONCAT44(extraout_var,iVar1);
    VVar3 = VmType::Struct((long)size,structType);
    (pVVar2->super_VmValue).typeID = 1;
    (pVVar2->super_VmValue).type = VVar3;
    (pVVar2->super_VmValue).source = source;
    (pVVar2->super_VmValue).comment.begin = (char *)0x0;
    (pVVar2->super_VmValue).comment.end = (char *)0x0;
    (pVVar2->super_VmValue).users.allocator = allocator;
    (pVVar2->super_VmValue).users.data = (pVVar2->super_VmValue).users.little;
    (pVVar2->super_VmValue).users.count = 0;
    (pVVar2->super_VmValue).users.max = 8;
    (pVVar2->super_VmValue).hasSideEffects = false;
    (pVVar2->super_VmValue).hasMemoryAccess = false;
    (pVVar2->super_VmValue).canBeRemoved = true;
    (pVVar2->super_VmValue).hasKnownSimpleUse = false;
    (pVVar2->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar2->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003f8d38;
    pVVar2->iValue = 0;
    pVVar2->sValue = (char *)0x0;
    pVVar2->bValue = (VmBlock *)0x0;
    pVVar2->dValue = 0.0;
    pVVar2->lValue = 0;
    pVVar2->fValue = (VmFunction *)0x0;
    pVVar2->container = (VariableData *)0x0;
    pVVar2->isFloat = false;
    pVVar2->isReference = false;
    pVVar2->sValue = value;
    return pVVar2;
  }
  __assert_fail("size % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x7c,
                "VmConstant *CreateConstantStruct(Allocator *, SynBase *, char *, int, TypeBase *)")
  ;
}

Assistant:

VmConstant* CreateConstantStruct(Allocator *allocator, SynBase *source, char *value, int size, TypeBase *structType)
{
	assert(size % 4 == 0);

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Struct(size, structType), source);

	result->sValue = value;

	return result;
}